

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::DefineTextureFromImage::DefineTextureFromImage
          (DefineTextureFromImage *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,
          SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,bool useSync,bool serverSync)

{
  Texture *pTVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40;
  
  Operation::Operation(&this->super_Operation,"DefineTextureFromImage",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DefineTextureFromImage_01e087c8;
  (this->m_texture).m_ptr = (Texture *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  (this->m_image).m_ptr = (EGLImage *)0x0;
  (this->m_image).m_state = (SharedPtrStateBase *)0x0;
  local_40.m_ptr = &image->m_ptr->super_Object;
  local_40.m_state = image->m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readGLObject(&this->super_Operation,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_40);
  local_50.m_ptr = &texture->m_ptr->super_Object;
  local_50.m_state = texture->m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_50);
  pTVar1 = texture->m_ptr;
  pTVar1->isDefined = true;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&pTVar1->sourceImage,image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=(&this->m_image,image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=(&this->m_texture,texture);
  return;
}

Assistant:

DefineTextureFromImage::DefineTextureFromImage (SharedPtr<Texture> texture, SharedPtr<EGLImage> image, bool useSync, bool serverSync)
	: Operation	("DefineTextureFromImage", useSync, serverSync)
{
	readGLObject(SharedPtr<Object>(image));
	modifyGLObject(SharedPtr<Object>(texture));

	texture->isDefined		= true;
	texture->sourceImage	= image;

	m_image		= image;
	m_texture	= texture;
}